

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

int check_vless_link(char *vless,FileName *varray,char *to_file,int *highest_p)

{
  uint uVar1;
  __ino_t _Var2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  FileName *pFVar11;
  FileName *pFVar12;
  bool bVar13;
  char ver [16];
  stat sbuf;
  char name [255];
  char dir [4096];
  
  alarm(TIMEOUT_TIME);
  piVar4 = __errno_location();
  do {
    *piVar4 = 0;
    iVar3 = stat(vless,(stat *)&sbuf);
    if (iVar3 != -1) break;
  } while (*piVar4 == 4);
  iVar9 = 0;
  alarm(0);
  _Var2 = sbuf.st_ino;
  if (iVar3 == 0) {
    if (sbuf.st_nlink == 1) {
      *to_file = '\0';
    }
    else {
      iVar3 = unpack_filename(vless,dir,name,ver,1);
      if (iVar3 == 0) {
        return 0;
      }
      bVar13 = false;
      uVar10 = 0;
      pFVar12 = (FileName *)0x0;
      pFVar11 = (FileName *)0x0;
      while( true ) {
        uVar1 = varray->version_no;
        if (uVar1 == 0xffffffff) break;
        if (uVar10 < uVar1) {
          pFVar12 = varray;
          uVar10 = uVar1;
        }
        if (bVar13) {
          bVar13 = true;
        }
        else {
          pcVar5 = dir;
          pcVar7 = dir;
          if (uVar1 == 0) {
            bVar13 = false;
          }
          else {
            for (; (pcVar8 = pcVar7, *pcVar7 == '/' || (pcVar8 = pcVar5, *pcVar7 != '\0'));
                pcVar7 = pcVar7 + 1) {
              pcVar5 = pcVar8;
            }
            if (pcVar7 + -1 == pcVar5) {
              if (pcVar5 == dir) {
                name[0] = '/';
                name[1] = '\0';
              }
              else {
                strcpy(name,dir);
              }
            }
            else {
              strcpy(name,dir);
              sVar6 = strlen(name);
              (name + sVar6)[0] = '/';
              (name + sVar6)[1] = '\0';
            }
            strcat(name,varray->name);
            alarm(TIMEOUT_TIME);
            do {
              *piVar4 = 0;
              iVar3 = stat(name,(stat *)&sbuf);
              if (iVar3 != -1) break;
            } while (*piVar4 == 4);
            alarm(0);
            if (iVar3 != 0) {
              *Lisp_errno = *piVar4;
              return 0;
            }
            bVar13 = sbuf.st_ino == _Var2;
            if (bVar13) {
              pFVar11 = varray;
            }
          }
        }
        varray = varray + 1;
      }
      if (pFVar11 == (FileName *)0x0) {
        *to_file = '\0';
      }
      else {
        *highest_p = (uint)(pFVar11 == pFVar12);
        strcpy(to_file,name);
      }
    }
    iVar9 = 1;
  }
  else {
    *Lisp_errno = *piVar4;
  }
  return iVar9;
}

Assistant:

static int check_vless_link(char *vless, FileName *varray, char *to_file, int *highest_p)
{
  int rval, found;
  unsigned max_no;
  ino_t vless_ino;
  struct stat sbuf;
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  FileName *max_entry, *linked_entry;

  TIMEOUT(rval = stat(vless, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (0);
  }

  if (sbuf.st_nlink == 1) {
    /* There is no file to which vless is hard linked. */
    *to_file = '\0';
    return (1);
  }
  vless_ino = sbuf.st_ino;

  if (unpack_filename(vless, dir, name, ver, 1) == 0) return (0);

  max_no = 0;
  found = 0;
  max_entry = NULL;
  linked_entry = NULL;

  while (varray->version_no != LASTVERSIONARRAY) {
    if (varray->version_no > max_no) {
      max_no = varray->version_no;
      max_entry = varray;
    }
    if (!found && varray->version_no != 0) {
      ConcDirAndName(dir, varray->name, name);
      TIMEOUT(rval = stat(name, &sbuf));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (0);
      }
      if (sbuf.st_ino == vless_ino) {
        found = 1;
        linked_entry = varray;
      }
    }
    varray++;
  }

  if (linked_entry != NULL) {
    if (linked_entry == max_entry) {
      *highest_p = 1;
    } else {
      *highest_p = 0;
    }
    strcpy(to_file, name);
  } else {
    *to_file = '\0';
  }
  return (1);
}